

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

void inclinenumber(LexState *ls)

{
  size_t sVar1;
  byte *pbVar2;
  int iVar3;
  uint local_1c;
  uint local_18;
  int old;
  LexState *ls_local;
  
  iVar3 = ls->current;
  sVar1 = ls->z->n;
  ls->z->n = sVar1 - 1;
  if (sVar1 == 0) {
    local_18 = luaZ_fill(ls->z);
  }
  else {
    pbVar2 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar2 + 1);
    local_18 = (uint)*pbVar2;
  }
  ls->current = local_18;
  if (((ls->current == 10) || (ls->current == 0xd)) && (ls->current != iVar3)) {
    sVar1 = ls->z->n;
    ls->z->n = sVar1 - 1;
    if (sVar1 == 0) {
      local_1c = luaZ_fill(ls->z);
    }
    else {
      pbVar2 = (byte *)ls->z->p;
      ls->z->p = (char *)(pbVar2 + 1);
      local_1c = (uint)*pbVar2;
    }
    ls->current = local_1c;
  }
  iVar3 = ls->linenumber + 1;
  ls->linenumber = iVar3;
  if (0x7ffffffc < iVar3) {
    lexerror(ls,"chunk has too many lines",0);
  }
  return;
}

Assistant:

static void inclinenumber (LexState *ls) {
  int old = ls->current;
  lua_assert(currIsNewline(ls));
  next(ls);  /* skip `\n' or `\r' */
  if (currIsNewline(ls) && ls->current != old)
    next(ls);  /* skip `\n\r' or `\r\n' */
  if (++ls->linenumber >= MAX_INT)
    lexerror(ls, "chunk has too many lines", 0);
}